

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBezierCurve.cpp
# Opt level: O3

void __thiscall
chrono::ChBezierCurve::ChBezierCurve
          (ChBezierCurve *this,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *points)

{
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *this_00;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *this_01;
  ulong n;
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  pointer pCVar9;
  pointer pCVar10;
  pointer pCVar11;
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  long lVar15;
  double *rhs;
  double *x;
  double *x_00;
  double *x_01;
  pointer pCVar16;
  double *pdVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong __new_size;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::vector
            (&this->m_points,points);
  (this->m_inCV).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_outCV).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_outCV).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_outCV).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_inCV).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_inCV).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_inCV).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_outCV).
  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lVar18 = (long)(points->
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(points->
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  lVar15 = lVar18 >> 3;
  __new_size = lVar15 * -0x5555555555555555;
  if (__new_size < 2) {
    __assert_fail("numPoints > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/core/ChBezierCurve.cpp"
                  ,0x4c,"chrono::ChBezierCurve::ChBezierCurve(const std::vector<ChVector<>> &)");
  }
  this_00 = &this->m_inCV;
  this_01 = &this->m_outCV;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
            (this_00,__new_size);
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
            (this_01,__new_size);
  pCVar9 = (points->
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar16 = (this_00->
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pCVar9 != pCVar16) {
    pCVar16->m_data[0] = pCVar9->m_data[0];
    pCVar16->m_data[1] = pCVar9->m_data[1];
    pCVar16->m_data[2] = pCVar9->m_data[2];
  }
  n = __new_size - 1;
  pCVar10 = (this_01->
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pCVar11 = pCVar9 + n;
  if (pCVar9 != pCVar10) {
    pCVar10[n].m_data[0] = pCVar11->m_data[0];
    pCVar10[n].m_data[1] = pCVar11->m_data[1];
    pCVar10[n].m_data[2] = pCVar11->m_data[2];
  }
  if (lVar18 == 0x30) {
    dVar1 = pCVar9->m_data[2];
    dVar13 = pCVar9->m_data[1];
    dVar2 = pCVar9[1].m_data[2];
    dVar14 = pCVar9[1].m_data[1];
    pCVar10->m_data[0] =
         (pCVar9->m_data[0] + pCVar9->m_data[0] + pCVar9[1].m_data[0]) * 0.3333333333333333;
    pCVar10->m_data[1] = (dVar13 + dVar13 + dVar14) * 0.3333333333333333;
    pCVar10->m_data[2] = (dVar1 + dVar1 + dVar2) * 0.3333333333333333;
    dVar1 = pCVar9[1].m_data[2];
    dVar2 = pCVar9->m_data[2];
    dVar13 = pCVar9[1].m_data[1];
    dVar14 = pCVar9->m_data[1];
    pCVar16[1].m_data[0] =
         (pCVar9[1].m_data[0] + pCVar9[1].m_data[0] + pCVar9->m_data[0]) * 0.3333333333333333;
    pCVar16[1].m_data[1] = (dVar13 + dVar13 + dVar14) * 0.3333333333333333;
    pCVar16[1].m_data[2] = (dVar1 + dVar1 + dVar2) * 0.3333333333333333;
    return;
  }
  uVar19 = -(ulong)(n >> 0x3d != 0) | n * 8;
  rhs = (double *)operator_new__(uVar19);
  x = (double *)operator_new__(uVar19);
  x_00 = (double *)operator_new__(uVar19);
  x_01 = (double *)operator_new__(uVar19);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = pCVar9[1].m_data[0];
  uVar19 = __new_size - 2;
  if (1 < uVar19) {
    pCVar16 = pCVar9 + 2;
    lVar18 = 0;
    auVar33 = ZEXT1664(auVar21);
    do {
      dVar1 = pCVar16->m_data[0];
      pCVar16 = pCVar16 + 1;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = dVar1 + dVar1;
      auVar36 = vfmadd231sd_fma(auVar36,auVar33._0_16_,ZEXT816(0x4010000000000000));
      auVar33 = ZEXT864((ulong)dVar1);
      rhs[lVar18 + 1] = auVar36._0_8_;
      lVar18 = lVar18 + 1;
    } while (__new_size - 3 != lVar18);
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = pCVar9->m_data[0];
  auVar21 = vfmadd213sd_fma(auVar21,ZEXT816(0x4000000000000000),auVar3);
  *rhs = auVar21._0_8_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = pCVar9[uVar19].m_data[0];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = pCVar11->m_data[0];
  auVar21 = vfmadd213sd_fma(auVar22,ZEXT816(0x4020000000000000),auVar4);
  rhs[lVar15 * 0xaaaaaaaaaaaaaab + -2] = auVar21._0_8_ * 0.5;
  solveTriDiag(n,rhs,x);
  pCVar9 = (points->
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = pCVar9[1].m_data[1];
  if (1 < uVar19) {
    pdVar17 = pCVar9[2].m_data + 1;
    lVar18 = 0;
    auVar33 = ZEXT1664(auVar23);
    do {
      dVar1 = *pdVar17;
      pdVar17 = pdVar17 + 3;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = dVar1 + dVar1;
      auVar21 = vfmadd231sd_fma(auVar37,auVar33._0_16_,ZEXT816(0x4010000000000000));
      auVar33 = ZEXT864((ulong)dVar1);
      rhs[lVar18 + 1] = auVar21._0_8_;
      lVar18 = lVar18 + 1;
    } while (__new_size - 3 != lVar18);
  }
  auVar5._8_8_ = 0;
  auVar5._0_8_ = pCVar9->m_data[1];
  auVar21 = vfmadd213sd_fma(auVar23,ZEXT816(0x4000000000000000),auVar5);
  *rhs = auVar21._0_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = pCVar9[uVar19].m_data[1];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = pCVar9[n].m_data[1];
  auVar21 = vfmadd213sd_fma(auVar24,ZEXT816(0x4020000000000000),auVar6);
  rhs[lVar15 * 0xaaaaaaaaaaaaaab + -2] = auVar21._0_8_ * 0.5;
  solveTriDiag(n,rhs,x_00);
  pCVar9 = (points->
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = pCVar9[1].m_data[2];
  if (1 < uVar19) {
    pdVar17 = pCVar9[2].m_data + 2;
    lVar18 = 0;
    auVar33 = ZEXT1664(auVar25);
    do {
      dVar1 = *pdVar17;
      pdVar17 = pdVar17 + 3;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = dVar1 + dVar1;
      auVar21 = vfmadd231sd_fma(auVar38,auVar33._0_16_,ZEXT816(0x4010000000000000));
      auVar33 = ZEXT864((ulong)dVar1);
      rhs[lVar18 + 1] = auVar21._0_8_;
      lVar18 = lVar18 + 1;
    } while (__new_size - 3 != lVar18);
  }
  auVar7._8_8_ = 0;
  auVar7._0_8_ = pCVar9->m_data[2];
  auVar21 = vfmadd213sd_fma(auVar25,ZEXT816(0x4000000000000000),auVar7);
  *rhs = auVar21._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = pCVar9[uVar19].m_data[2];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = pCVar9[n].m_data[2];
  auVar21 = vfmadd213sd_fma(ZEXT816(0x4020000000000000),auVar26,auVar8);
  rhs[lVar15 * 0xaaaaaaaaaaaaaab + -2] = auVar21._0_8_ * 0.5;
  solveTriDiag(n,rhs,x_01);
  pCVar9 = (this_01->
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar16 = (points->
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pCVar11 = (this_00->
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (uVar19 != 0) {
    auVar33 = ZEXT864((ulong)*x);
    auVar34 = ZEXT864((ulong)*x_00);
    auVar35._8_8_ = 0;
    auVar35._0_8_ = *x_01;
    auVar30._8_8_ = 0x4000000000000000;
    auVar30._0_8_ = 0x4000000000000000;
    lVar18 = 2;
    lVar20 = 2;
    do {
      pCVar9->m_data[lVar18 + -2] = auVar33._0_8_;
      pCVar9->m_data[lVar18 + -1] = auVar34._0_8_;
      pCVar9->m_data[lVar18] = auVar35._0_8_;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = x[lVar20 + -1];
      auVar33 = ZEXT1664(auVar27);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = x_00[lVar20 + -1];
      auVar34 = ZEXT1664(auVar32);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = x_01[lVar20 + -1];
      auVar39._8_8_ = 0;
      auVar39._0_8_ = pCVar16[1].m_data[lVar18];
      lVar20 = lVar20 + 1;
      auVar21 = vunpcklpd_avx(auVar27,auVar32);
      auVar21 = vfmsub231pd_fma(auVar21,auVar30,*(undefined1 (*) [16])(pCVar16->m_data + lVar18 + 1)
                               );
      auVar36 = vfmsub213sd_fma(auVar39,ZEXT816(0x4000000000000000),auVar35);
      *(undefined1 (*) [16])(pCVar11->m_data + lVar18 + 1) = auVar21;
      pCVar11[1].m_data[lVar18] = auVar36._0_8_;
      lVar18 = lVar18 + 3;
    } while (__new_size - lVar20 != 0);
  }
  auVar28._8_8_ = 0;
  auVar28._0_8_ = x[lVar15 * 0xaaaaaaaaaaaaaab + -2];
  dVar1 = x_00[lVar15 * 0xaaaaaaaaaaaaaab + -2];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar1;
  dVar2 = x_01[lVar15 * 0xaaaaaaaaaaaaaab + -2];
  pCVar9[uVar19].m_data[0] = x[lVar15 * 0xaaaaaaaaaaaaaab + -2];
  pCVar9[uVar19].m_data[1] = dVar1;
  pCVar9[uVar19].m_data[2] = dVar2;
  auVar21 = vunpcklpd_avx(auVar28,auVar31);
  dVar1 = pCVar16[n].m_data[2];
  auVar29._0_8_ = auVar21._0_8_ + pCVar16[n].m_data[0];
  auVar29._8_8_ = auVar21._8_8_ + pCVar16[n].m_data[1];
  auVar12._8_8_ = 0x3fe0000000000000;
  auVar12._0_8_ = 0x3fe0000000000000;
  auVar21 = vmulpd_avx512vl(auVar29,auVar12);
  *(undefined1 (*) [16])pCVar11[n].m_data = auVar21;
  pCVar11[n].m_data[2] = (dVar2 + dVar1) * 0.5;
  operator_delete__(rhs);
  operator_delete__(x);
  operator_delete__(x_00);
  operator_delete__(x_01);
  return;
}

Assistant:

ChBezierCurve::ChBezierCurve(const std::vector<ChVector<> >& points) : m_points(points) {
    size_t numPoints = points.size();
    assert(numPoints > 1);

    m_inCV.resize(numPoints);
    m_outCV.resize(numPoints);

    m_inCV[0] = points[0];
    m_outCV[numPoints - 1] = points[numPoints - 1];

    // Special case for two points only.  In this case, the curve should be a
    // straight line.
    if (numPoints == 2) {
        m_outCV[0] = (2.0 * points[0] + points[1]) / 3.0;
        m_inCV[1] = (points[0] + 2.0 * points[1]) / 3.0;
        return;
    }

    /*
    // Calculate control points
    // Use heuristic approach from http://www.antigrain.com/research/bezier_interpolation/index.html

    //// NOTE: Does not produce a proper Bezier vurve and as such requires a different eval() function!!!

    static const double smooth_value = 0.2;

    // Calculate centers and lengths
    size_t numIntervals = numPoints - 1;
    std::vector<ChVector<>> center(numIntervals);
    std::vector<double> length(numIntervals);
    for (int i = 0; i < numIntervals; i++) {
        center[i] = (points[i] + points[i + 1]) / 2;
        length[i] = (points[i + 1] - points[i]).Length();
    }

    // Calculate control points
    for (size_t i = 0; i < numIntervals; i++) {
        // Interval i: [p(i), p(i+1)] -> set outCV(i) & inCV(i+1)

        double len1 = (i == 0) ? 0 : length[i-1];
        double len2 = length[i];
        double len3 = (i == numIntervals - 1) ? 0 : length[i + 1];

        auto c1 = (i == 0) ? points[0] : center[i - 1];
        auto c2 = center[i];
        auto c3 = (i == numIntervals - 1) ? points[i + 1] : center[i + 1];

        double k1 = len1 / (len1 + len2);
        double k2 = len2 / (len2 + len3);

        auto m1 = c1 + (c2 - c1) * k1;
        auto m2 = c2 + (c2 - c2) * k2;

        m_outCV[i] = m1 + (c2 - m1) * smooth_value + points[i] - m1;
        m_inCV[i + 1] = m2 + (c2 - m2) * smooth_value + points[i + 1] - m2;
    }
    */

    // Calculate coordinates of the outCV control points.
    size_t n = numPoints - 1;
    double* rhs = new double[n];
    double* x = new double[n];
    double* y = new double[n];
    double* z = new double[n];

    // X coordinates.
    for (size_t i = 1; i < n - 1; ++i)
        rhs[i] = 4 * points[i].x() + 2 * points[i + 1].x();
    rhs[0] = points[0].x() + 2 * points[1].x();
    rhs[n - 1] = (8 * points[n - 1].x() + points[n].x()) / 2;
    solveTriDiag(n, rhs, x);

    // Y coordinates.
    for (size_t i = 1; i < n - 1; ++i)
        rhs[i] = 4 * points[i].y() + 2 * points[i + 1].y();
    rhs[0] = points[0].y() + 2 * points[1].y();
    rhs[n - 1] = (8 * points[n - 1].y() + points[n].y()) / 2;
    solveTriDiag(n, rhs, y);

    // Z coordinates.
    for (size_t i = 1; i < n - 1; ++i)
        rhs[i] = 4 * points[i].z() + 2 * points[i + 1].z();
    rhs[0] = points[0].z() + 2 * points[1].z();
    rhs[n - 1] = (8 * points[n - 1].z() + points[n].z()) / 2;
    solveTriDiag(n, rhs, z);

    // Set control points outCV and inCV.
    for (size_t i = 0; i < n - 1; i++) {
        m_outCV[i] = ChVector<>(x[i], y[i], z[i]);
        m_inCV[i + 1] =
            ChVector<>(2 * points[i + 1].x() - x[i + 1], 2 * points[i + 1].y() - y[i + 1], 2 * points[i + 1].z() - z[i + 1]);
    }
    m_outCV[n - 1] = ChVector<>(x[n - 1], y[n - 1], z[n - 1]);
    m_inCV[n] = ChVector<>((points[n].x() + x[n - 1]) / 2, (points[n].y() + y[n - 1]) / 2, (points[n].z() + z[n - 1]) / 2);

    // Cleanup.
    delete[] rhs;
    delete[] x;
    delete[] y;
    delete[] z;
}